

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O1

int mbedtls_hmac_drbg_reseed(mbedtls_hmac_drbg_context *ctx,uchar *additional,size_t len)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uchar seed [384];
  uchar auStack_1a8 [384];
  
  iVar2 = -5;
  if (len < 0x101) {
    sVar3 = ctx->entropy_len;
    iVar2 = -5;
    if (sVar3 + len < 0x181) {
      memset(auStack_1a8,0,0x180);
      iVar1 = (*ctx->f_entropy)(ctx->p_entropy,auStack_1a8,sVar3);
      iVar2 = -9;
      if (iVar1 == 0) {
        sVar3 = ctx->entropy_len;
        if (len != 0 && additional != (uchar *)0x0) {
          memcpy(auStack_1a8 + sVar3,additional,len);
          sVar3 = sVar3 + len;
        }
        mbedtls_hmac_drbg_update(ctx,auStack_1a8,sVar3);
        ctx->reseed_counter = 1;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_hmac_drbg_reseed( mbedtls_hmac_drbg_context *ctx,
                      const unsigned char *additional, size_t len )
{
    unsigned char seed[MBEDTLS_HMAC_DRBG_MAX_SEED_INPUT];
    size_t seedlen;

    /* III. Check input length */
    if( len > MBEDTLS_HMAC_DRBG_MAX_INPUT ||
        ctx->entropy_len + len > MBEDTLS_HMAC_DRBG_MAX_SEED_INPUT )
    {
        return( MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG );
    }

    memset( seed, 0, MBEDTLS_HMAC_DRBG_MAX_SEED_INPUT );

    /* IV. Gather entropy_len bytes of entropy for the seed */
    if( ctx->f_entropy( ctx->p_entropy, seed, ctx->entropy_len ) != 0 )
        return( MBEDTLS_ERR_HMAC_DRBG_ENTROPY_SOURCE_FAILED );

    seedlen = ctx->entropy_len;

    /* 1. Concatenate entropy and additional data if any */
    if( additional != NULL && len != 0 )
    {
        memcpy( seed + seedlen, additional, len );
        seedlen += len;
    }

    /* 2. Update state */
    mbedtls_hmac_drbg_update( ctx, seed, seedlen );

    /* 3. Reset reseed_counter */
    ctx->reseed_counter = 1;

    /* 4. Done */
    return( 0 );
}